

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

ostream * notch::io::operator<<(ostream *out,valarray<double> *xs)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  
  lVar1 = *(long *)xs;
  pdVar2 = *(double **)(xs + 8);
  pdVar4 = pdVar2;
  if (lVar1 == 0) {
    pdVar4 = (double *)0x0;
  }
  while( true ) {
    pdVar3 = pdVar2 + lVar1;
    if (lVar1 == 0) {
      pdVar3 = (double *)0x0;
    }
    if (pdVar4 == pdVar3) break;
    if (lVar1 == 0) {
      pdVar2 = (double *)0x0;
    }
    if (pdVar4 != pdVar2) {
      std::operator<<(out," ");
    }
    std::ostream::_M_insert<double>(*pdVar4);
    lVar1 = *(long *)xs;
    pdVar2 = *(double **)(xs + 8);
    pdVar4 = pdVar4 + 1;
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::valarray<double> &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}